

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QFactoryLoader_*>::reallocateAndGrow
          (QArrayDataPointer<QFactoryLoader_*> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QFactoryLoader_*> *old)

{
  long lVar1;
  bool bVar2;
  QFactoryLoader **ppQVar3;
  QPodArrayOps<QFactoryLoader_*> *this_00;
  long in_RCX;
  long in_RDX;
  GrowthPosition in_ESI;
  QArrayDataPointer<QFactoryLoader_*> *in_RDI;
  long in_FS_OFFSET;
  qsizetype toCopy;
  QArrayDataPointer<QFactoryLoader_*> dp;
  undefined4 in_stack_ffffffffffffff68;
  AllocationOption in_stack_ffffffffffffff6c;
  QArrayDataPointer<QFactoryLoader_*> *in_stack_ffffffffffffff70;
  QArrayDataPointer<QFactoryLoader_*> *in_stack_ffffffffffffff78;
  QArrayDataPointer<QFactoryLoader_*> *n_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  n_00 = in_RDI;
  if ((((in_ESI != GrowsAtEnd) || (in_RCX != 0)) ||
      (bVar2 = needsDetach(in_stack_ffffffffffffff70), bVar2)) || (in_RDX < 1)) {
    allocateGrow((QArrayDataPointer<QFactoryLoader_*> *)&DAT_aaaaaaaaaaaaaaaa,(qsizetype)n_00,in_ESI
                );
    if ((0 < in_RDX) &&
       (ppQVar3 = data((QArrayDataPointer<QFactoryLoader_*> *)&stack0xffffffffffffffe0),
       ppQVar3 == (QFactoryLoader **)0x0)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        qBadAlloc();
      }
      goto LAB_004538d4;
    }
    if (in_RDI->size != 0) {
      bVar2 = needsDetach(in_stack_ffffffffffffff70);
      if ((bVar2) || (in_RCX != 0)) {
        this_00 = (QPodArrayOps<QFactoryLoader_*> *)
                  operator->((QArrayDataPointer<QFactoryLoader_*> *)&stack0xffffffffffffffe0);
        begin((QArrayDataPointer<QFactoryLoader_*> *)0x4537e7);
        begin((QArrayDataPointer<QFactoryLoader_*> *)0x4537f6);
        QtPrivate::QPodArrayOps<QFactoryLoader_*>::copyAppend
                  (this_00,(QFactoryLoader **)in_stack_ffffffffffffff78,
                   (QFactoryLoader **)in_stack_ffffffffffffff70);
      }
      else {
        in_stack_ffffffffffffff70 =
             (QArrayDataPointer<QFactoryLoader_*> *)
             operator->((QArrayDataPointer<QFactoryLoader_*> *)&stack0xffffffffffffffe0);
        begin((QArrayDataPointer<QFactoryLoader_*> *)0x45382f);
        begin((QArrayDataPointer<QFactoryLoader_*> *)0x45383e);
        QtPrivate::QPodArrayOps<QFactoryLoader_*>::moveAppend
                  ((QPodArrayOps<QFactoryLoader_*> *)in_stack_ffffffffffffff70,
                   (QFactoryLoader **)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                   (QFactoryLoader **)0x45385c);
      }
    }
    swap(in_stack_ffffffffffffff70,
         (QArrayDataPointer<QFactoryLoader_*> *)
         CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    if (in_RCX != 0) {
      swap(in_stack_ffffffffffffff70,
           (QArrayDataPointer<QFactoryLoader_*> *)
           CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    }
    ~QArrayDataPointer(in_stack_ffffffffffffff70);
  }
  else {
    operator->(in_RDI);
    constAllocatedCapacity(in_stack_ffffffffffffff70);
    freeSpaceAtEnd(in_stack_ffffffffffffff78);
    QtPrivate::QPodArrayOps<QFactoryLoader_*>::reallocate
              ((QPodArrayOps<QFactoryLoader_*> *)in_stack_ffffffffffffff78,
               (qsizetype)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_004538d4:
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }